

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

int ScanEol(ConfigScanner *sc)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = sc->ptr;
  cVar1 = *pcVar2;
  if (cVar1 == '\0') {
    return 1;
  }
  if (cVar1 == '\r') {
    sc->ptr = pcVar2 + 1;
    if (pcVar2[1] != '\n') {
      return 1;
    }
    pcVar2 = pcVar2 + 2;
  }
  else {
    if (cVar1 != '\n') {
      return 0;
    }
    pcVar2 = pcVar2 + 1;
  }
  sc->ptr = pcVar2;
  return 1;
}

Assistant:

int ScanEol(ConfigScanner *sc)
{
	switch (*sc->ptr)
	{
	case '\0':
		return true;
	case '\n':
		sc->ptr++;
		return true;
	case '\r':
		sc->ptr++;
		if (*sc->ptr == '\n')
		{
			sc->ptr++;
		}
		return true;
	default:
		return false;
	}
}